

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimPerformOne(Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    pvVar3 = Vec_PtrEntry(vSimInfo,pNode->Id);
    pvVar4 = Vec_PtrEntry(vSimInfo,*(pNode->vFanins).pArray);
    pvVar5 = Vec_PtrEntry(vSimInfo,(pNode->vFanins).pArray[1]);
    uVar1 = *(uint *)&pNode->field_0x14;
    if ((uVar1 >> 0xb & 1) == 0 || (uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 10 & 1) == 0 || (uVar1 >> 0xb & 1) != 0) {
        uVar2 = 0;
        if (0 < nSimWords) {
          uVar2 = nSimWords;
        }
        if (((byte)(uVar1 >> 0xb) & (uVar1 >> 10 & 1) == 0) == 0) {
          for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
            *(uint *)((long)pvVar3 + uVar7 * 4) =
                 *(uint *)((long)pvVar5 + uVar7 * 4) & *(uint *)((long)pvVar4 + uVar7 * 4);
          }
        }
        else {
          for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
            *(uint *)((long)pvVar3 + uVar7 * 4) =
                 ~*(uint *)((long)pvVar5 + uVar7 * 4) & *(uint *)((long)pvVar4 + uVar7 * 4);
          }
        }
      }
      else {
        uVar7 = 0;
        uVar6 = (ulong)(uint)nSimWords;
        if (nSimWords < 1) {
          uVar6 = 0;
        }
        for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *(uint *)((long)pvVar3 + uVar7 * 4) =
               ~*(uint *)((long)pvVar4 + uVar7 * 4) & *(uint *)((long)pvVar5 + uVar7 * 4);
        }
      }
    }
    else {
      uVar6 = 0;
      uVar7 = (ulong)(uint)nSimWords;
      if (nSimWords < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(uint *)((long)pvVar3 + uVar6 * 4) =
             ~(*(uint *)((long)pvVar5 + uVar6 * 4) | *(uint *)((long)pvVar4 + uVar6 * 4));
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                ,0x178,"void Res_SimPerformOne(Abc_Obj_t *, Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimPerformOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords )
{
    unsigned * pInfo, * pInfo1, * pInfo2;
    int k, fComp1, fComp2;
    // simulate the internal nodes
    assert( Abc_ObjIsNode(pNode) );
    pInfo  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pInfo1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pInfo2 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId1(pNode));
    fComp1 = Abc_ObjFaninC0(pNode);
    fComp2 = Abc_ObjFaninC1(pNode);
    if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] = ~pInfo1[k] & ~pInfo2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] = ~pInfo1[k] &  pInfo2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] =  pInfo1[k] & ~pInfo2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < nSimWords; k++ )
            pInfo[k] =  pInfo1[k] &  pInfo2[k];
}